

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_table.cpp
# Opt level: O0

void __thiscall ArrayTable_NumericKey_Test::TestBody(ArrayTable_NumericKey_Test *this)

{
  pointer *this_00;
  allocator<sax_event_t> *this_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  value;
  initializer_list<sax_event_t> __l;
  bool bVar1;
  char *message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3c8;
  sax_event_t *local_3b0;
  AssertHelper local_378;
  Message local_370;
  undefined1 local_368 [8];
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  iterator local_328;
  size_type local_320;
  undefined1 local_318 [96];
  sax_event_t local_2b8;
  sax_event_t local_260;
  iterator local_208;
  pointer local_200;
  undefined1 local_1f8 [8];
  vector<sax_event_t,_std::allocator<sax_event_t>_> expected_events;
  events_aggregator_t handler;
  allocator local_1b1;
  string local_1b0 [32];
  istringstream local_190 [8];
  istringstream input;
  ArrayTable_NumericKey_Test *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"[[123]]",&local_1b1);
  std::__cxx11::istringstream::istringstream(local_190,local_1b0,8);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  this_00 = &expected_events.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  events_aggregator_t::events_aggregator_t((events_aggregator_t *)this_00);
  loltoml::v_0_1_1::parse<events_aggregator_t>((istream *)local_190,(events_aggregator_t *)this_00);
  gtest_ar.message_.ptr_._5_1_ = 1;
  local_318._0_8_ = local_318 + 8;
  sax_event_t::sax_event_t((sax_event_t *)local_318._0_8_,start_document);
  gtest_ar.message_.ptr_._6_1_ = 1;
  local_318._0_8_ = &local_2b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_348,"123",(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  gtest_ar.message_.ptr_._6_1_ = 0;
  local_328 = &local_348;
  local_320 = 1;
  value._M_len = 1;
  value._M_array = local_328;
  sax_event_t::sax_event_t(&local_2b8,table_array_item,value);
  local_318._0_8_ = &local_260;
  sax_event_t::sax_event_t((sax_event_t *)local_318._0_8_,finish_document);
  gtest_ar.message_.ptr_._5_1_ = 0;
  local_208 = (iterator)(local_318 + 8);
  local_200 = (pointer)0x3;
  this_01 = (allocator<sax_event_t> *)((long)&gtest_ar.message_.ptr_ + 4);
  std::allocator<sax_event_t>::allocator(this_01);
  __l._M_len = (size_type)local_200;
  __l._M_array = local_208;
  std::vector<sax_event_t,_std::allocator<sax_event_t>_>::vector
            ((vector<sax_event_t,_std::allocator<sax_event_t>_> *)local_1f8,__l,this_01);
  std::allocator<sax_event_t>::~allocator
            ((allocator<sax_event_t> *)((long)&gtest_ar.message_.ptr_ + 4));
  local_3b0 = (sax_event_t *)&local_208;
  do {
    local_3b0 = local_3b0 + -1;
    sax_event_t::~sax_event_t(local_3b0);
  } while (local_3b0 != (sax_event_t *)(local_318 + 8));
  local_3c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_328;
  do {
    local_3c8 = local_3c8 + -1;
    std::__cxx11::string::~string((string *)local_3c8);
  } while (local_3c8 != &local_348);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  testing::internal::EqHelper<false>::
  Compare<std::vector<sax_event_t,std::allocator<sax_event_t>>,std::vector<sax_event_t,std::allocator<sax_event_t>>>
            ((EqHelper<false> *)local_368,"expected_events","handler.events",
             (vector<sax_event_t,_std::allocator<sax_event_t>_> *)local_1f8,
             (vector<sax_event_t,_std::allocator<sax_event_t>_> *)
             &expected_events.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
  if (!bVar1) {
    testing::Message::Message(&local_370);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_368);
    testing::internal::AssertHelper::AssertHelper
              (&local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/andrusha97[P]loltoml/tests/array_table.cpp"
               ,0x21,message);
    testing::internal::AssertHelper::operator=(&local_378,&local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_378);
    testing::Message::~Message(&local_370);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
  std::vector<sax_event_t,_std::allocator<sax_event_t>_>::~vector
            ((vector<sax_event_t,_std::allocator<sax_event_t>_> *)local_1f8);
  events_aggregator_t::~events_aggregator_t
            ((events_aggregator_t *)
             &expected_events.super__Vector_base<sax_event_t,_std::allocator<sax_event_t>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::istringstream::~istringstream(local_190);
  return;
}

Assistant:

TEST(ArrayTable, NumericKey) {
    std::istringstream input("[[123]]");
    events_aggregator_t handler;

    loltoml::parse(input, handler);

    std::vector<sax_event_t> expected_events = {
        {sax_event_t::start_document},
        {sax_event_t::table_array_item, {"123"}},
        {sax_event_t::finish_document}
    };

    EXPECT_EQ(expected_events, handler.events);
}